

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_ReadVarint64_Test::TestBody
          (VarintCasesWithSizes_ReadVarint64_Test *this)

{
  ParamType *pPVar1;
  ParamType *pPVar2;
  byte bVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  pair<unsigned_long,_bool> pVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  uint64_t value;
  CodedInputStream coded_input;
  ArrayInputStream input;
  AssertHelper local_e0;
  AssertHelper local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  AssertHelper local_a8;
  unsigned_long local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  ArrayInputStream *local_88;
  undefined7 local_80;
  undefined1 uStack_79;
  undefined7 uStack_78;
  undefined8 local_70;
  int local_68;
  int local_64;
  int local_60;
  DescriptorPool *local_58;
  MessageFactory *pMStack_50;
  ArrayInputStream local_40;
  
  pPVar1 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  memcpy(&io::(anonymous_namespace)::CodedStreamTest::buffer_,
         &(pPVar1->
          super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
          super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>,
         (pPVar1->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
         _M_head_impl.size);
  ArrayInputStream::ArrayInputStream
            (&local_40,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
             (pPVar2->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_98 = (undefined1  [8])0x0;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80 = 0;
  uStack_79 = 0;
  uStack_78._0_4_ = 0;
  uStack_78._4_1_ = false;
  uStack_78._5_1_ = false;
  uStack_78._6_1_ = false;
  local_70._0_4_ = 0x7fffffff;
  local_70._4_4_ = 0;
  local_68 = 0x7fffffff;
  local_64 = CodedInputStream::default_recursion_limit_;
  local_60 = CodedInputStream::default_recursion_limit_;
  local_58 = (DescriptorPool *)0x0;
  pMStack_50 = (MessageFactory *)0x0;
  local_88 = &local_40;
  CodedInputStream::Refresh((CodedInputStream *)local_98);
  if (((ulong)local_98 < pbStack_90) &&
     (local_a0 = (unsigned_long)*(char *)&((_Alloc_hider *)local_98)->_M_p, -1 < (long)local_a0)) {
    local_98 = (undefined1  [8])((long)&((_Alloc_hider *)local_98)->_M_p + 1);
    bVar3 = 1;
  }
  else {
    pVar5 = CodedInputStream::ReadVarint64Fallback((CodedInputStream *)local_98);
    bVar3 = pVar5.second;
    local_a0 = pVar5.first;
  }
  local_d8.data_._0_1_ = (internal)(bVar3 & 1);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_d8,
               (AssertionResult *)"coded_input.ReadVarint64(&value)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xfd,(char *)local_c8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_c8 != (undefined1  [8])&local_b8) {
      operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
    }
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"kVarintCases_case.value","value",
             &(pPVar1->
              super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
              super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
              _M_head_impl.value,&local_a0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_98);
  local_c8 = (undefined1  [8])ArrayInputStream::ByteCount(&local_40);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)local_98,"kVarintCases_case.size","input.ByteCount()",
             &(pPVar1->
              super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
              super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
              _M_head_impl.size,(long *)local_c8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x101,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, ReadVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadVarint64(&value));
    EXPECT_EQ(kVarintCases_case.value, value);
  }

  EXPECT_EQ(kVarintCases_case.size, input.ByteCount());
}